

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O0

size_t __thiscall llvm::StringRef::rfind(StringRef *this,char C,size_t From)

{
  unsigned_long *puVar1;
  unsigned_long local_30;
  size_t i;
  size_t From_local;
  StringRef *pSStack_18;
  char C_local;
  StringRef *this_local;
  
  i = From;
  From_local._7_1_ = C;
  pSStack_18 = this;
  puVar1 = std::min<unsigned_long>(&i,&this->Length);
  local_30 = *puVar1;
  do {
    if (local_30 == 0) {
      return 0xffffffffffffffff;
    }
    local_30 = local_30 - 1;
  } while (this->Data[local_30] != From_local._7_1_);
  return local_30;
}

Assistant:

LLVM_NODISCARD
    size_t rfind(char C, size_t From = npos) const {
      From = std::min(From, Length);
      size_t i = From;
      while (i != 0) {
        --i;
        if (Data[i] == C)
          return i;
      }
      return npos;
    }